

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O2

void __thiscall
JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::EnsureArray
          (GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this)

{
  uint uVar1;
  uint32 uVar2;
  WasmType *pWVar3;
  
  if (this->buffer == (Type)0x0) {
    pWVar3 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmTypes::WasmType,false>
                       ((Memory *)this->alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)this->length);
    this->buffer = pWVar3;
    this->count = 0;
  }
  else if (this->count == this->length) {
    uVar2 = UInt32Math::AddMul<1u,2u>(this->count);
    pWVar3 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmTypes::WasmType,false>
                       ((Memory *)this->alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)uVar2);
    Memory::CopyArray<Wasm::WasmTypes::WasmType,Wasm::WasmTypes::WasmType,Memory::ArenaAllocator>
              (pWVar3,(ulong)uVar2,this->buffer,(ulong)this->length);
    uVar1 = this->length;
    if ((ulong)uVar1 != 0) {
      if (0x3fffffff < uVar1) {
        Math::DefaultOverflowPolicy();
      }
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&this->alloc->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                 this->buffer,(ulong)uVar1 << 2);
    }
    this->length = uVar2;
    this->buffer = pWVar3;
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }